

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_doing(Curl_easy *data,_Bool *dophase_done)

{
  CURLcode CVar1;
  
  CVar1 = smtp_multi_statemach(data,dophase_done);
  if (((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, *dophase_done == true)) &&
     (((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
    CVar1 = CURLE_OK;
    Curl_setup_transfer(data,-1,-1,false,-1);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = smtp_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = smtp_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  return result;
}